

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

IGUIElement * __thiscall
irr::gui::CGUIEnvironment::getNextElement(CGUIEnvironment *this,bool reverse,bool group)

{
  IGUIElement **ppIVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  s32 startOrder;
  char cVar5;
  IGUIElement *pIVar6;
  IGUIElement *ret;
  IGUIElement *this_00;
  IGUIElement *first;
  IGUIElement *closest;
  
  pIVar6 = this->Focus;
  startOrder = -1;
  this_00 = pIVar6;
  if (pIVar6 == (IGUIElement *)0x0) {
    cVar5 = '\0';
    this_00 = (IGUIElement *)0x0;
  }
  else {
    do {
      cVar5 = this_00->IsTabGroup;
      if ((bool)cVar5 != false) {
        if (!group) goto LAB_00218c24;
        startOrder = this_00->TabOrder;
        cVar5 = '\x01';
        goto LAB_00218c55;
      }
      ppIVar1 = &this_00->Parent;
      this_00 = *ppIVar1;
    } while (*ppIVar1 != (IGUIElement *)0x0);
    this_00 = (IGUIElement *)0x0;
    if (group) {
      cVar5 = '\0';
    }
    else {
LAB_00218c24:
      if (pIVar6->IsTabGroup == false) {
        iVar4 = pIVar6->TabOrder;
        iVar3 = startOrder;
        while ((startOrder = iVar4, startOrder == -1 &&
               (pIVar6 = pIVar6->Parent, startOrder = iVar3, pIVar6 != (IGUIElement *)0x0))) {
          iVar3 = pIVar6->TabOrder;
          iVar4 = iVar3;
        }
      }
    }
  }
LAB_00218c55:
  puVar2 = &(this->super_IGUIEnvironment).field_0x8;
  if (group) {
    this_00 = (IGUIElement *)puVar2;
  }
  pIVar6 = (IGUIElement *)0x0;
  if (group) {
    pIVar6 = (IGUIElement *)puVar2;
  }
  closest = (IGUIElement *)0x0;
  first = (IGUIElement *)0x0;
  if (cVar5 == '\0') {
    this_00 = (IGUIElement *)puVar2;
  }
  IGUIElement::getNextElement
            (this_00,startOrder,reverse,group,&first,&closest,false,(this->FocusFlags & 0x16) != 0);
  if (first != (IGUIElement *)0x0) {
    pIVar6 = first;
  }
  if (closest != (IGUIElement *)0x0) {
    pIVar6 = closest;
  }
  return pIVar6;
}

Assistant:

IGUIElement *CGUIEnvironment::getNextElement(bool reverse, bool group)
{
	// start the search at the root of the current tab group
	IGUIElement *startPos = Focus ? Focus->getTabGroup() : 0;
	s32 startOrder = -1;

	// if we're searching for a group
	if (group && startPos) {
		startOrder = startPos->getTabOrder();
	} else if (!group && Focus && !Focus->isTabGroup()) {
		startOrder = Focus->getTabOrder();
		if (startOrder == -1) {
			// this element is not part of the tab cycle,
			// but its parent might be...
			IGUIElement *el = Focus;
			while (el && el->getParent() && startOrder == -1) {
				el = el->getParent();
				startOrder = el->getTabOrder();
			}
		}
	}

	if (group || !startPos)
		startPos = this; // start at the root

	// find the element
	IGUIElement *closest = 0;
	IGUIElement *first = 0;
	startPos->getNextElement(startOrder, reverse, group, first, closest, false, (FocusFlags & EFF_CAN_FOCUS_DISABLED) != 0);

	if (closest)
		return closest; // we found an element
	else if (first)
		return first; // go to the end or the start
	else if (group)
		return this; // no group found? root group
	else
		return 0;
}